

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall RangeSize::RangeSize(RangeSize *this,IntVar *_x,IntVar *_y)

{
  undefined8 in_RDX;
  _func_int **in_RSI;
  Propagator *in_RDI;
  
  Propagator::Propagator(in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__RangeSize_0031ed78;
  in_RDI[1]._vptr_Propagator = in_RSI;
  in_RDI[1].prop_id = (int)in_RDX;
  in_RDI[1].priority = (int)((ulong)in_RDX >> 0x20);
  in_RDI->priority = 1;
  (**(code **)(*in_RDI[1]._vptr_Propagator + 0x38))(in_RDI[1]._vptr_Propagator,in_RDI,0,6);
  return;
}

Assistant:

RangeSize(IntVar* _x, IntVar* _y) : x(_x), y(_y) {
		priority = 1;
		x->attach(this, 0, EVENT_LU);
	}